

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int r1f3kb_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  double *local_118;
  int local_10c;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  double *local_78;
  
  iVar23 = *l1;
  if (0 < (long)iVar23) {
    iVar1 = *in1;
    lVar14 = (long)iVar1;
    iVar2 = *ido;
    lVar20 = (long)iVar2;
    lVar22 = (long)(~(iVar2 * 4) * iVar1 + -1);
    lVar15 = (long)*in2;
    uVar6 = iVar23 + 1;
    iVar7 = ~(uVar6 * iVar2) * *in2 + -1;
    pdVar12 = ch + (((ulong)(uint)(iVar23 * 3) + 1) * lVar20 + 1) * lVar15 + 1;
    lVar17 = lVar20 * lVar15;
    pdVar3 = ch + (((long)(iVar23 * 2) + 1) * lVar20 + 1) * lVar15 + 1;
    lVar8 = ((long)iVar23 + 1) * lVar20;
    pdVar16 = ch + (lVar8 + 1) * lVar15 + 1;
    lVar19 = (lVar20 * 6 + 1) * lVar14;
    lVar11 = lVar20 * lVar14;
    iVar10 = iVar2 * iVar1 * 6;
    lVar24 = (lVar20 * 4 + 1) * lVar14;
    pdVar9 = cc + lVar22 + 1;
    lVar5 = (ulong)uVar6 - 1;
    pdVar4 = pdVar9;
    do {
      pdVar16[iVar7] = pdVar9[iVar10] + pdVar9[iVar10] + pdVar4[lVar24];
      pdVar3[iVar7] =
           pdVar4[lVar19] * -1.7320508075688774 +
           pdVar9[iVar10] * -0.9999999999999996 + pdVar4[lVar24];
      pdVar12[iVar7] =
           pdVar4[lVar19] * 1.7320508075688774 +
           pdVar9[iVar10] * -0.9999999999999996 + pdVar4[lVar24];
      pdVar12 = pdVar12 + lVar17;
      pdVar3 = pdVar3 + lVar17;
      pdVar16 = pdVar16 + lVar17;
      pdVar4 = pdVar4 + lVar11 * 3;
      iVar10 = iVar10 + iVar2 * iVar1 * 3;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (iVar2 != 1 && 0 < iVar23) {
      local_78 = cc + (lVar20 * 5 + (long)(iVar2 + 2) + -3) * lVar14 + 1;
      lVar5 = ((ulong)(uint)(iVar23 * 3) + 1) * lVar20;
      local_80 = ch + (lVar5 + 3) * lVar15 + 1;
      lVar19 = ((long)(iVar23 * 2) + 1) * lVar20;
      local_88 = ch + (lVar19 + 3) * lVar15 + 1;
      local_90 = cc + (lVar20 * 6 + 3) * lVar14 + 1;
      local_98 = cc + (lVar20 * 4 + 3) * lVar14 + 1;
      local_a0 = cc + (lVar20 * 4 + 2) * lVar14 + 1;
      local_a8 = cc + (lVar20 * 6 + 2) * lVar14 + 1;
      local_b0 = ch + (lVar8 + 3) * lVar15 + 1;
      local_b8 = ch + (lVar8 + 2) * lVar15 + 1;
      local_c0 = ch + (lVar19 + 2) * lVar15 + 1;
      local_c8 = ch + (lVar5 + 2) * lVar15 + 1;
      local_10c = (iVar2 * 6 + -2) * iVar1;
      uVar13 = 1;
      do {
        if (2 < iVar2) {
          lVar5 = 3;
          local_f0 = local_c8;
          local_f8 = local_c0;
          local_100 = local_88;
          local_108 = local_80;
          local_118 = local_78;
          pdVar4 = local_a0;
          pdVar3 = local_98;
          pdVar12 = local_b0;
          pdVar16 = local_a8;
          pdVar18 = local_90;
          pdVar21 = local_b8;
          iVar23 = local_10c;
          do {
            pdVar21[iVar7] = pdVar16[lVar22] + pdVar9[iVar23] + pdVar4[lVar22];
            pdVar12[iVar7] = (pdVar18[lVar22] - local_118[lVar22]) + pdVar3[lVar22];
            local_f8[iVar7] =
                 ((pdVar18[lVar22] + local_118[lVar22]) * -0.8660254037844387 +
                 (pdVar16[lVar22] + pdVar9[iVar23]) * -0.4999999999999998 + pdVar4[lVar22]) *
                 wa1[lVar5 + -3] -
                 ((pdVar16[lVar22] - pdVar9[iVar23]) * 0.8660254037844387 +
                 (pdVar18[lVar22] - local_118[lVar22]) * -0.4999999999999998 + pdVar3[lVar22]) *
                 wa1[lVar5 + -2];
            local_100[iVar7] =
                 ((pdVar16[lVar22] - pdVar9[iVar23]) * 0.8660254037844387 +
                 (pdVar18[lVar22] - local_118[lVar22]) * -0.4999999999999998 + pdVar3[lVar22]) *
                 wa1[lVar5 + -3] +
                 ((pdVar18[lVar22] + local_118[lVar22]) * -0.8660254037844387 +
                 (pdVar16[lVar22] + pdVar9[iVar23]) * -0.4999999999999998 + pdVar4[lVar22]) *
                 wa1[lVar5 + -2];
            local_f0[iVar7] =
                 ((pdVar18[lVar22] + local_118[lVar22]) * 0.8660254037844387 +
                 (pdVar16[lVar22] + pdVar9[iVar23]) * -0.4999999999999998 + pdVar4[lVar22]) *
                 wa2[lVar5 + -3] -
                 ((pdVar16[lVar22] - pdVar9[iVar23]) * -0.8660254037844387 +
                 (pdVar18[lVar22] - local_118[lVar22]) * -0.4999999999999998 + pdVar3[lVar22]) *
                 wa2[lVar5 + -2];
            local_108[iVar7] =
                 ((pdVar16[lVar22] - pdVar9[iVar23]) * -0.8660254037844387 +
                 (pdVar18[lVar22] - local_118[lVar22]) * -0.4999999999999998 + pdVar3[lVar22]) *
                 wa2[lVar5 + -3] +
                 ((pdVar18[lVar22] + local_118[lVar22]) * 0.8660254037844387 +
                 (pdVar16[lVar22] + pdVar9[iVar23]) * -0.4999999999999998 + pdVar4[lVar22]) *
                 wa2[lVar5 + -2];
            lVar5 = lVar5 + 2;
            local_118 = local_118 + lVar14 * -2;
            iVar23 = iVar23 + iVar1 * -2;
            local_108 = local_108 + lVar15 * 2;
            local_100 = local_100 + lVar15 * 2;
            pdVar12 = pdVar12 + lVar15 * 2;
            pdVar18 = pdVar18 + lVar14 * 2;
            pdVar3 = pdVar3 + lVar14 * 2;
            pdVar4 = pdVar4 + lVar14 * 2;
            pdVar16 = pdVar16 + lVar14 * 2;
            pdVar21 = pdVar21 + lVar15 * 2;
            local_f8 = local_f8 + lVar15 * 2;
            local_f0 = local_f0 + lVar15 * 2;
          } while (lVar5 <= lVar20);
        }
        uVar13 = uVar13 + 1;
        local_78 = local_78 + lVar11 * 3;
        local_10c = local_10c + iVar1 * iVar2 * 3;
        local_80 = local_80 + lVar17;
        local_88 = local_88 + lVar17;
        local_b0 = local_b0 + lVar17;
        local_90 = local_90 + lVar11 * 3;
        local_98 = local_98 + lVar11 * 3;
        local_a0 = local_a0 + lVar11 * 3;
        local_a8 = local_a8 + lVar11 * 3;
        local_b8 = local_b8 + lVar17;
        local_c0 = local_c0 + lVar17;
        local_c8 = local_c8 + lVar17;
      } while (uVar13 != uVar6);
    }
  }
  return 0;
}

Assistant:

int r1f3kb_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_offset, ch_dim1, ch_dim2, ch_dim3, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg;
     int idp2;
     fft_real_t taui, taur;


    /* Parameter adjustments */
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + (cc_dim2 << 2));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 3.0;
    taur = cos(arg);
    taui = sin(arg);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k + ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[(*ido + (k * 3 + 2) *
		cc_dim2) * cc_dim1 + 1] * 2.0;
	ch[((k + (ch_dim3 << 1)) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 +
		1) * cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k
		* 3 + 2) * cc_dim2) * cc_dim1 + 1] - taui * 2.0 * cc[((k * 3
		+ 3) * cc_dim2 + 1) * cc_dim1 + 1];
	ch[((k + ch_dim3 * 3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1)
		* cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k *
		3 + 2) * cc_dim2) * cc_dim1 + 1] + taui * 2.0 * cc[((k * 3 +
		3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ -
		    1 + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ - 1
		    + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k
		    * 3 + 2) * cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ + (k * 3 + 3)
		     * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ - 1 + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] =
		    wa1[i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa1[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] = wa1[
		    i__ - 2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 +
		    1] + taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) +
		    taui * (cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]))
		    + wa1[i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[
		    i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa2[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[i__ -
		    2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] +
		    taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] -
		    cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) - taui * (
		    cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1])) + wa2[
		    i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
/* L102: */
	}
/* L103: */
    }
    return 0;
}